

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSystem::IfcSystem(IfcSystem *this,void **vtt)

{
  void *pvVar1;
  
  IfcGroup::IfcGroup(&this->super_IfcGroup,vtt + 1);
  pvVar1 = vtt[0x17];
  *(void **)&(this->super_IfcGroup).super_IfcObject.field_0xe0 = pvVar1;
  *(void **)(&(this->super_IfcGroup).super_IfcObject.field_0xe0 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x18];
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcGroup).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcGroup).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x19];
  *(void **)&(this->super_IfcGroup).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcGroup).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcGroup).super_IfcObject.field_0xe0 = vtt[0x1d];
  return;
}

Assistant:

IfcSystem() : Object("IfcSystem") {}